

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O3

CURLcode smtp_multi_statemach(connectdata *conn,_Bool *done)

{
  _Bool *done_00;
  CURLcode CVar1;
  
  if (((conn->handler->flags & 1) != 0) && ((conn->proto).imapc.ssldone == false)) {
    done_00 = &(conn->proto).imapc.ssldone;
    CVar1 = Curl_ssl_connect_nonblocking(conn,0,done_00);
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
    if (*done_00 != true) {
      return CURLE_OK;
    }
  }
  CVar1 = Curl_pp_statemach(&(conn->proto).ftpc.pp,false);
  *done = (conn->proto).imapc.state == IMAP_STOP;
  return CVar1;
}

Assistant:

static CURLcode smtp_multi_statemach(struct connectdata *conn, bool *done)
{
  CURLcode result = CURLE_OK;
  struct smtp_conn *smtpc = &conn->proto.smtpc;

  if((conn->handler->flags & PROTOPT_SSL) && !smtpc->ssldone) {
    result = Curl_ssl_connect_nonblocking(conn, FIRSTSOCKET, &smtpc->ssldone);
    if(result || !smtpc->ssldone)
      return result;
  }

  result = Curl_pp_statemach(&smtpc->pp, FALSE);
  *done = (smtpc->state == SMTP_STOP) ? TRUE : FALSE;

  return result;
}